

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

CURLcode Curl_ssl_peer_init(ssl_peer *peer,Curl_cfilter *cf,int transport)

{
  connectdata *pcVar1;
  char *__s2;
  proxy_info *ppVar2;
  proxy_info *ppVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  int *piVar8;
  CURLcode CVar9;
  ulong n;
  ssl_peer_type sVar10;
  bool bVar11;
  undefined1 local_40 [16];
  
  peer->transport = transport;
  pcVar1 = cf->conn;
  ppVar2 = &pcVar1->http_proxy;
  ppVar3 = &pcVar1->http_proxy;
  bVar11 = (~cf->cft->flags & 10U) != 0;
  if (bVar11) {
    ppVar3 = (proxy_info *)&pcVar1->host;
    ppVar2 = (proxy_info *)&pcVar1->host;
  }
  pcVar6 = (ppVar2->host).name;
  __s2 = (ppVar3->host).dispname;
  piVar8 = &(pcVar1->http_proxy).port;
  if (bVar11) {
    piVar8 = &pcVar1->remote_port;
  }
  peer->port = *piVar8;
  CVar9 = CURLE_FAILED_INIT;
  if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
    pcVar5 = (*Curl_cstrdup)(pcVar6);
    peer->hostname = pcVar5;
    CVar9 = CURLE_OUT_OF_MEMORY;
    if (pcVar5 != (char *)0x0) {
      if ((__s2 == (char *)0x0) || (iVar4 = strcmp(pcVar6,__s2), iVar4 == 0)) {
        peer->dispname = pcVar5;
      }
      else {
        pcVar6 = (*Curl_cstrdup)(__s2);
        peer->dispname = pcVar6;
        if (pcVar6 == (char *)0x0) goto LAB_00172df3;
      }
      pcVar6 = peer->hostname;
      if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) {
LAB_00172d68:
        sVar10 = CURL_SSL_PEER_DNS;
      }
      else {
        sVar10 = CURL_SSL_PEER_IPV6;
        iVar4 = inet_pton(2,pcVar6,local_40);
        if (iVar4 == 0) {
          iVar4 = inet_pton(10,pcVar6,local_40);
          bVar11 = iVar4 == 0;
        }
        else {
          sVar10 = CURL_SSL_PEER_IPV4;
          bVar11 = false;
        }
        if (bVar11) goto LAB_00172d68;
      }
      peer->type = sVar10;
      if (sVar10 == CURL_SSL_PEER_DNS) {
        pcVar6 = peer->hostname;
        sVar7 = strlen(pcVar6);
        iVar4 = 0;
        if (sVar7 == 0) {
          n = 0;
        }
        else {
          n = sVar7 - (pcVar6[sVar7 - 1] == '.');
        }
        if (n < 0xffff) {
          pcVar6 = (char *)(*Curl_ccalloc)(1,n + 1);
          peer->sni = pcVar6;
          if (pcVar6 == (char *)0x0) {
            iVar4 = 10;
          }
          else {
            Curl_strntolower(pcVar6,peer->hostname,n);
            peer->sni[n] = '\0';
          }
        }
        if (iVar4 == 10) goto LAB_00172df3;
        if (iVar4 != 0) {
          return CURLE_OUT_OF_MEMORY;
        }
      }
      CVar9 = CURLE_OK;
      bVar11 = true;
      goto LAB_00172df5;
    }
  }
LAB_00172df3:
  bVar11 = false;
LAB_00172df5:
  if (!bVar11) {
    if (peer->dispname != peer->hostname) {
      (*Curl_cfree)(peer->dispname);
    }
    (*Curl_cfree)(peer->sni);
    (*Curl_cfree)(peer->hostname);
    *(undefined8 *)((long)&peer->dispname + 4) = 0;
    *(undefined8 *)((long)&peer->sni + 4) = 0;
    peer->hostname = (char *)0x0;
    peer->dispname = (char *)0x0;
  }
  return CVar9;
}

Assistant:

CURLcode Curl_ssl_peer_init(struct ssl_peer *peer, struct Curl_cfilter *cf,
                            int transport)
{
  const char *ehostname, *edispname;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  /* We expect a clean struct, e.g. called only ONCE */
  DEBUGASSERT(peer);
  DEBUGASSERT(!peer->hostname);
  DEBUGASSERT(!peer->dispname);
  DEBUGASSERT(!peer->sni);
  /* We need the hostname for SNI negotiation. Once handshaked, this remains
   * the SNI hostname for the TLS connection. When the connection is reused,
   * the settings in cf->conn might change. We keep a copy of the hostname we
   * use for SNI.
   */
  peer->transport = transport;
#ifndef CURL_DISABLE_PROXY
  if(Curl_ssl_cf_is_proxy(cf)) {
    ehostname = cf->conn->http_proxy.host.name;
    edispname = cf->conn->http_proxy.host.dispname;
    peer->port = cf->conn->http_proxy.port;
  }
  else
#endif
  {
    ehostname = cf->conn->host.name;
    edispname = cf->conn->host.dispname;
    peer->port = cf->conn->remote_port;
  }

  /* hostname MUST exist and not be empty */
  if(!ehostname || !ehostname[0]) {
    result = CURLE_FAILED_INIT;
    goto out;
  }

  peer->hostname = strdup(ehostname);
  if(!peer->hostname)
    goto out;
  if(!edispname || !strcmp(ehostname, edispname))
    peer->dispname = peer->hostname;
  else {
    peer->dispname = strdup(edispname);
    if(!peer->dispname)
      goto out;
  }
  peer->type = get_peer_type(peer->hostname);
  if(peer->type == CURL_SSL_PEER_DNS) {
    /* not an IP address, normalize according to RCC 6066 ch. 3,
     * max len of SNI is 2^16-1, no trailing dot */
    size_t len = strlen(peer->hostname);
    if(len && (peer->hostname[len-1] == '.'))
      len--;
    if(len < USHRT_MAX) {
      peer->sni = calloc(1, len + 1);
      if(!peer->sni)
        goto out;
      Curl_strntolower(peer->sni, peer->hostname, len);
      peer->sni[len] = 0;
    }
  }
  result = CURLE_OK;

out:
  if(result)
    Curl_ssl_peer_cleanup(peer);
  return result;
}